

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

size_t __thiscall Jupiter::IRC::Client::messageChannels(Client *this,int type,string_view message)

{
  _Hash_node_base *p_Var1;
  string_view dest;
  
  for (p_Var1 = (this->m_channels)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if (*(int *)&p_Var1[10]._M_nxt == type) {
      dest._M_str = (char *)p_Var1[5]._M_nxt;
      dest._M_len = (size_t)p_Var1[6]._M_nxt;
      sendMessage(this,dest,message);
    }
  }
  return (this->m_channels)._M_h._M_element_count;
}

Assistant:

size_t Jupiter::IRC::Client::messageChannels(int type, std::string_view message) {
	for (auto& channel : m_channels) {
		if (channel.second.getType() == type) {
			sendMessage(channel.second.getName(), message);
		}
	}

	return m_channels.size();
}